

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O2

void __thiscall helics::InputInfo::setProperty(InputInfo *this,int32_t option,int32_t value)

{
  pointer piVar1;
  bool bVar2;
  value_type_conflict2 local_4;
  
  bVar2 = value != 0;
  if (option == 0x18d) {
    this->required = bVar2;
  }
  else if (option == 0x192) {
    this->required = value == 0;
  }
  else {
    if (option == 0x197) {
      bVar2 = value != 0;
    }
    else {
      if (option != 0x199) {
        if (option == 0x19e) {
          this->strict_type_matching = bVar2;
          return;
        }
        if (option == 0x1bf) {
          this->ignore_unit_mismatch = bVar2;
          return;
        }
        if (option == 0x1c6) {
          this->only_update_on_change = bVar2;
          return;
        }
        if (option == 0x22d) {
          (this->minTimeGap).internalTimeCode = (long)value * 1000000;
          return;
        }
        if (option == 0x1fe) {
          std::vector<int,_std::allocator<int>_>::push_back(&this->priority_sources,&local_4);
          return;
        }
        if (option == 0x200) {
          piVar1 = (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish == piVar1) {
            return;
          }
          (this->priority_sources).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = piVar1;
          return;
        }
        if (option == 0x20a) {
          this->required_connnections = value;
          return;
        }
        if (option != 0x1db) {
          return;
        }
        this->not_interruptible = bVar2;
        return;
      }
      bVar2 = value == 0;
    }
    this->required_connnections = (uint)bVar2;
  }
  return;
}

Assistant:

void InputInfo::setProperty(int32_t option, int32_t value)
{
    bool bvalue = (value != 0);
    switch (option) {
        case defs::Options::IGNORE_INTERRUPTS:
            not_interruptible = bvalue;
            break;
        case defs::Options::HANDLE_ONLY_UPDATE_ON_CHANGE:
            only_update_on_change = bvalue;
            break;
        case defs::Options::CONNECTION_REQUIRED:
            required = bvalue;
            break;
        case defs::Options::CONNECTION_OPTIONAL:
            required = !bvalue;
            break;
        case defs::Options::SINGLE_CONNECTION_ONLY:
            required_connnections = bvalue ? 1 : 0;
            break;
        case defs::Options::MULTIPLE_CONNECTIONS_ALLOWED:
            required_connnections = bvalue ? 0 : 1;
            break;
        case defs::Options::STRICT_TYPE_CHECKING:
            strict_type_matching = bvalue;
            break;
        case defs::Options::IGNORE_UNIT_MISMATCH:
            ignore_unit_mismatch = bvalue;
            break;
        case defs::Options::CONNECTIONS:
            required_connnections = value;
            break;
        case defs::Options::INPUT_PRIORITY_LOCATION:
            priority_sources.push_back(value);
            break;
        case defs::Options::CLEAR_PRIORITY_LIST:
            priority_sources.clear();
            break;
        case defs::Options::TIME_RESTRICTED:
            minTimeGap = Time(value, time_units::ms);
            break;
        default:
            break;
    }
}